

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRD2File.cpp
# Opt level: O2

void __thiscall BRD2File::BRD2File(BRD2File *this,vector<char,_std::allocator<char>_> *buf)

{
  vector<BRDPin,_std::allocator<BRDPin>_> *this_00;
  vector<BRDPart,_std::allocator<BRDPart>_> *this_01;
  byte bVar1;
  pointer __src;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  size_t __size;
  string *psVar5;
  BRDFileBase *pBVar6;
  int iVar7;
  int iVar8;
  BRDPartMountingSide BVar9;
  char *buffer;
  long lVar10;
  long lVar11;
  iterator iVar12;
  mapped_type *ppcVar13;
  char *pcVar14;
  ostream *poVar15;
  byte *pbVar16;
  size_t __n;
  uint *puVar17;
  long lVar18;
  bool bVar19;
  uint uVar20;
  ulong uVar21;
  byte *pbVar22;
  byte *pbVar23;
  int iVar24;
  int *piVar25;
  char *p;
  allocator<char> local_269;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  int netid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  BRDFileBase *local_178;
  uint *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  BRDPoint point;
  BRDPart part;
  long local_c8;
  ulong local_b0;
  char *arena;
  vector<BRDNail,_std::allocator<BRDNail>_> *local_a0;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *local_98;
  pointer local_90;
  vector<char_*,_std::allocator<char_*>_> lines;
  unordered_map<int,_char_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_char_*>_>_>
  nets;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_00203308;
  uVar21 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  nets._M_h._M_buckets = &nets._M_h._M_single_bucket;
  nets._M_h._M_bucket_count = 1;
  nets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  nets._M_h._M_element_count = 0;
  nets._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  nets._M_h._M_rehash_policy._M_next_resize = 0;
  nets._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_178 = &this->super_BRDFileBase;
  if (uVar21 < 5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
               ,(allocator<char> *)&point);
    std::operator+(&local_220,&local_260,":");
    std::__cxx11::to_string(&local_240,0x14);
    std::operator+(&local_200,&local_220,&local_240);
    std::operator+(&local_1e0,&local_200,": ");
    std::operator+(&local_1c0,&local_1e0,"BRD2File::BRD2File(std::vector<char> &)");
    std::operator+(&local_198,&local_1c0,": Assertion `");
    std::operator+(&local_168,&local_198,"buffer_size > 4");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                   &local_168,"\' failed.");
    std::__cxx11::string::operator=((string *)&(this->super_BRDFileBase).error_msg,(string *)&part);
    std::__cxx11::string::~string((string *)&part);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_260);
    SDL_LogError(1,"%s",(this->super_BRDFileBase).error_msg._M_dataplus._M_p);
  }
  else {
    __size = (uVar21 + 1) * 3;
    buffer = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = buffer;
    if (buffer == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                 ,(allocator<char> *)&point);
      pBVar6 = local_178;
      std::operator+(&local_220,&local_260,":");
      std::__cxx11::to_string(&local_240,0x17);
      std::operator+(&local_200,&local_220,&local_240);
      std::operator+(&local_1e0,&local_200,": ");
      std::operator+(&local_1c0,&local_1e0,"BRD2File::BRD2File(std::vector<char> &)");
      std::operator+(&local_198,&local_1c0,": Assertion `");
      std::operator+(&local_168,&local_198,"file_buf != nullptr");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                     &local_168,"\' failed.");
      std::__cxx11::string::operator=((string *)&pBVar6->error_msg,(string *)&part);
      std::__cxx11::string::~string((string *)&part);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_260);
      SDL_LogError(1,"%s",(pBVar6->error_msg)._M_dataplus._M_p);
    }
    else {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(buffer,__src,__n);
      }
      buffer[uVar21] = '\0';
      arena = buffer + uVar21 + 1;
      buffer[__size - 1] = '\0';
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      stringfile(buffer,&lines);
      local_90 = lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_a0 = &local_178->nails;
      local_268 = (string *)&local_178->error_msg;
      this_00 = &local_178->pins;
      this_01 = &local_178->parts;
      local_98 = &local_178->format;
      local_c8 = 0;
      lVar10 = 0;
      iVar8 = 0;
      local_b0 = 0;
      puVar17 = (uint *)lines.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
      while( true ) {
        iVar24 = (int)lVar10;
        if ((pointer)puVar17 == local_90) break;
        pbVar16 = *(byte **)puVar17;
        pbVar23 = pbVar16 + -1;
        local_170 = puVar17;
        do {
          pbVar22 = pbVar23;
          pbVar16 = pbVar16 + 1;
          bVar1 = pbVar22[1];
          pbVar23 = pbVar22 + 1;
          iVar7 = isspace((uint)bVar1);
        } while (iVar7 != 0);
        puVar17 = local_170;
        if (bVar1 != 0) {
          p = (char *)pbVar23;
          iVar7 = strncmp((char *)pbVar23,"BRDOUT:",7);
          if (iVar7 == 0) {
            p = (char *)(pbVar22 + 8);
            lVar10 = strtol(p,&p,10);
            pBVar6 = local_178;
            if ((int)(uint)lVar10 < 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_260,
                         "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                         ,(allocator<char> *)&point);
              std::operator+(&local_220,&local_260,":");
              std::__cxx11::to_string(&local_240,0x2f);
              std::operator+(&local_200,&local_220,&local_240);
              std::operator+(&local_1e0,&local_200,": ");
              std::operator+(&local_1c0,&local_1e0,
                             "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                            );
              std::operator+(&local_198,&local_1c0,": Assertion `");
              std::operator+(&local_168,&local_198,"value >= 0");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &part,&local_168,"\' failed.");
              psVar5 = local_268;
              std::__cxx11::string::operator=(local_268,(string *)&part);
              std::__cxx11::string::~string((string *)&part);
              std::__cxx11::string::~string((string *)&local_168);
              std::__cxx11::string::~string((string *)&local_198);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::__cxx11::string::~string((string *)&local_1e0);
              std::__cxx11::string::~string((string *)&local_200);
              std::__cxx11::string::~string((string *)&local_240);
              std::__cxx11::string::~string((string *)&local_220);
              std::__cxx11::string::~string((string *)&local_260);
              SDL_LogError(1,"%s",*(undefined8 *)psVar5);
            }
            pBVar6->num_format = (uint)lVar10;
            local_c8 = strtol(p,&p,10);
            lVar10 = strtol(p,&p,10);
            iVar8 = 1;
            puVar17 = local_170;
          }
          else {
            iVar7 = strncmp((char *)pbVar23,"NETS:",5);
            if (iVar7 == 0) {
              p = (char *)(pbVar22 + 6);
              local_b0 = strtol(p,&p,10);
              if ((int)local_b0 < 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_260,
                           "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                           ,(allocator<char> *)&point);
                puVar17 = local_170;
                std::operator+(&local_220,&local_260,":");
                std::__cxx11::to_string(&local_240,0x37);
                std::operator+(&local_200,&local_220,&local_240);
                std::operator+(&local_1e0,&local_200,": ");
                std::operator+(&local_1c0,&local_1e0,
                               "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                              );
                std::operator+(&local_198,&local_1c0,": Assertion `");
                std::operator+(&local_168,&local_198,"value >= 0");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &part,&local_168,"\' failed.");
                psVar5 = local_268;
                std::__cxx11::string::operator=(local_268,(string *)&part);
                std::__cxx11::string::~string((string *)&part);
                std::__cxx11::string::~string((string *)&local_168);
                std::__cxx11::string::~string((string *)&local_198);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::__cxx11::string::~string((string *)&local_1e0);
                std::__cxx11::string::~string((string *)&local_200);
                std::__cxx11::string::~string((string *)&local_240);
                std::__cxx11::string::~string((string *)&local_220);
                std::__cxx11::string::~string((string *)&local_260);
                SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                iVar8 = 2;
              }
              else {
                iVar8 = 2;
                puVar17 = local_170;
              }
            }
            else {
              iVar7 = strncmp((char *)pbVar23,"PARTS:",6);
              if (iVar7 == 0) {
                p = (char *)(pbVar22 + 7);
                lVar11 = strtol(p,&p,10);
                puVar17 = local_170;
                if ((int)(uint)lVar11 < 0) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_260,
                             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                             ,(allocator<char> *)&point);
                  std::operator+(&local_220,&local_260,":");
                  std::__cxx11::to_string(&local_240,0x3d);
                  std::operator+(&local_200,&local_220,&local_240);
                  std::operator+(&local_1e0,&local_200,": ");
                  std::operator+(&local_1c0,&local_1e0,
                                 "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                );
                  std::operator+(&local_198,&local_1c0,": Assertion `");
                  std::operator+(&local_168,&local_198,"value >= 0");
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&part,&local_168,"\' failed.");
                  psVar5 = local_268;
                  std::__cxx11::string::operator=(local_268,(string *)&part);
                  std::__cxx11::string::~string((string *)&part);
                  std::__cxx11::string::~string((string *)&local_168);
                  std::__cxx11::string::~string((string *)&local_198);
                  std::__cxx11::string::~string((string *)&local_1c0);
                  std::__cxx11::string::~string((string *)&local_1e0);
                  std::__cxx11::string::~string((string *)&local_200);
                  std::__cxx11::string::~string((string *)&local_240);
                  std::__cxx11::string::~string((string *)&local_220);
                  std::__cxx11::string::~string((string *)&local_260);
                  SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                }
                local_178->num_parts = (uint)lVar11;
LAB_00126e86:
                iVar8 = 3;
              }
              else {
                iVar7 = strncmp((char *)pbVar23,"PINS:",5);
                if (iVar7 == 0) {
                  p = (char *)(pbVar22 + 6);
                  lVar11 = strtol(p,&p,10);
                  puVar17 = local_170;
                  if ((int)(uint)lVar11 < 0) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_260,
                               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                               ,(allocator<char> *)&point);
                    std::operator+(&local_220,&local_260,":");
                    std::__cxx11::to_string(&local_240,0x43);
                    std::operator+(&local_200,&local_220,&local_240);
                    std::operator+(&local_1e0,&local_200,": ");
                    std::operator+(&local_1c0,&local_1e0,
                                   "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                  );
                    std::operator+(&local_198,&local_1c0,": Assertion `");
                    std::operator+(&local_168,&local_198,"value >= 0");
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&part,&local_168,"\' failed.");
                    psVar5 = local_268;
                    std::__cxx11::string::operator=(local_268,(string *)&part);
                    std::__cxx11::string::~string((string *)&part);
                    std::__cxx11::string::~string((string *)&local_168);
                    std::__cxx11::string::~string((string *)&local_198);
                    std::__cxx11::string::~string((string *)&local_1c0);
                    std::__cxx11::string::~string((string *)&local_1e0);
                    std::__cxx11::string::~string((string *)&local_200);
                    std::__cxx11::string::~string((string *)&local_240);
                    std::__cxx11::string::~string((string *)&local_220);
                    std::__cxx11::string::~string((string *)&local_260);
                    SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                  }
                  local_178->num_pins = (uint)lVar11;
LAB_0012701a:
                  iVar8 = 4;
                }
                else {
                  iVar7 = strncmp((char *)pbVar23,"NAILS:",6);
                  if (iVar7 == 0) {
                    p = (char *)(pbVar22 + 7);
                    lVar11 = strtol(p,&p,10);
                    puVar17 = local_170;
                    if ((int)(uint)lVar11 < 0) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_260,
                                 "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                 ,(allocator<char> *)&point);
                      std::operator+(&local_220,&local_260,":");
                      std::__cxx11::to_string(&local_240,0x49);
                      std::operator+(&local_200,&local_220,&local_240);
                      std::operator+(&local_1e0,&local_200,": ");
                      std::operator+(&local_1c0,&local_1e0,
                                     "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                    );
                      std::operator+(&local_198,&local_1c0,": Assertion `");
                      std::operator+(&local_168,&local_198,"value >= 0");
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&part,&local_168,"\' failed.");
                      psVar5 = local_268;
                      std::__cxx11::string::operator=(local_268,(string *)&part);
                      std::__cxx11::string::~string((string *)&part);
                      std::__cxx11::string::~string((string *)&local_168);
                      std::__cxx11::string::~string((string *)&local_198);
                      std::__cxx11::string::~string((string *)&local_1c0);
                      std::__cxx11::string::~string((string *)&local_1e0);
                      std::__cxx11::string::~string((string *)&local_200);
                      std::__cxx11::string::~string((string *)&local_240);
                      std::__cxx11::string::~string((string *)&local_220);
                      std::__cxx11::string::~string((string *)&local_260);
                      SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                    }
                    local_178->num_nails = (uint)lVar11;
LAB_00128850:
                    iVar8 = 5;
                  }
                  else {
                    puVar17 = local_170;
                    switch(iVar8) {
                    case 1:
                      if ((ulong)local_178->num_format <=
                          (ulong)((long)(local_178->format).
                                        super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_178->format).
                                        super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3)) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&point);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x4f);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "BRD2File::BRD2File(std::vector<char> &)");
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"format.size() < num_format");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      point.x = 0;
                      point.y = 0;
                      lVar11 = strtol((char *)pbVar23,&p,10);
                      point.x = (int)lVar11;
                      lVar11 = strtol(p,&p,10);
                      puVar17 = local_170;
                      point.y = (int)lVar11;
                      iVar8 = (int)lVar11;
                      if ((int)local_c8 < point.x) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&netid);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x53);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "BRD2File::BRD2File(std::vector<char> &)");
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"point.x <= max.x");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                        iVar8 = point.y;
                      }
                      if (iVar24 < iVar8) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&netid);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x54);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "BRD2File::BRD2File(std::vector<char> &)");
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"point.y <= max.y");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      std::vector<BRDPoint,_std::allocator<BRDPoint>_>::push_back(local_98,&point);
                      iVar8 = 1;
                      break;
                    case 2:
                      if ((local_b0 & 0xffffffff) <= nets._M_h._M_element_count) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&point);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x59);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "BRD2File::BRD2File(std::vector<char> &)");
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"nets.size() < num_nets");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      lVar11 = strtol((char *)pbVar23,&p,10);
                      puVar17 = local_170;
                      if ((int)lVar11 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&netid);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x5a);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"value >= 0");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      point.x = (int)lVar11;
                      pbVar23 = (byte *)p;
                      pbVar16 = (byte *)p;
                      while( true ) {
                        pbVar16 = pbVar16 + 1;
                        uVar20 = (uint)*pbVar23;
                        if ((*pbVar23 == 0) || (iVar8 = isspace(uVar20), iVar8 == 0)) break;
                        pbVar23 = pbVar23 + 1;
                      }
                      while (((char)uVar20 != '\0' && (iVar8 = isspace(uVar20), iVar8 == 0))) {
                        uVar20 = (uint)*pbVar16;
                        pbVar16 = pbVar16 + 1;
                      }
                      pbVar16[-1] = 0;
                      p = (char *)pbVar16;
                      pcVar14 = fix_to_utf8((char *)pbVar23,&arena,buffer + (__size - 1));
                      ppcVar13 = std::__detail::
                                 _Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::operator[]((_Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                               *)&nets,&point.x);
                      *ppcVar13 = pcVar14;
                      iVar8 = 2;
                      break;
                    case 3:
                      if ((ulong)local_178->num_parts <=
                          (ulong)(((long)(local_178->parts).
                                         super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_178->parts).
                                        super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                                        _M_impl.super__Vector_impl_data._M_start) / 0x48)) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&point);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x5f);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "BRD2File::BRD2File(std::vector<char> &)");
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"parts.size() < num_parts");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      part.name = (char *)0x0;
                      part.mfgcode._M_dataplus._M_p = (pointer)&part.mfgcode.field_2;
                      part.mfgcode._M_string_length = 0;
                      part.mfgcode.field_2._M_allocated_capacity =
                           part.mfgcode.field_2._M_allocated_capacity & 0xffffffffffffff00;
                      part.p1.y = 0;
                      part.p2.x = 0;
                      part.p2.y = 0;
                      part.mounting_side = Both;
                      part.part_type = SMD;
                      part.end_of_pins = 0;
                      part.p1.x = 0;
                      while ((uVar20 = (uint)*pbVar23, *pbVar23 != 0 &&
                             (iVar8 = isspace(uVar20), iVar8 != 0))) {
                        pbVar23 = pbVar23 + 1;
                        pbVar16 = pbVar16 + 1;
                      }
                      while (((char)uVar20 != '\0' && (iVar8 = isspace(uVar20), iVar8 == 0))) {
                        uVar20 = (uint)*pbVar16;
                        pbVar16 = pbVar16 + 1;
                      }
                      pbVar16[-1] = 0;
                      p = (char *)pbVar16;
                      part.name = fix_to_utf8((char *)pbVar23,&arena,buffer + (__size - 1));
                      lVar11 = strtol((char *)pbVar16,&p,10);
                      part.p1.x = (int)lVar11;
                      lVar11 = strtol(p,&p,10);
                      part.p1.y = (int)lVar11;
                      lVar11 = strtol(p,&p,10);
                      part.p2.x = (int)lVar11;
                      lVar11 = strtol(p,&p,10);
                      part.p2.y = (int)lVar11;
                      lVar11 = strtol(p,&p,10);
                      puVar17 = local_170;
                      if ((int)(uint)lVar11 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_240,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&netid);
                        std::operator+(&local_260,&local_240,":");
                        std::__cxx11::to_string((string *)&point,0x67);
                        std::operator+(&local_220,&local_260,(string *)&point);
                        std::operator+(&local_200,&local_220,": ");
                        std::operator+(&local_1e0,&local_200,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_1c0,&local_1e0,": Assertion `");
                        std::operator+(&local_198,&local_1c0,"value >= 0");
                        std::operator+(&local_168,&local_198,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&point);
                        std::__cxx11::string::~string((string *)&local_260);
                        std::__cxx11::string::~string((string *)&local_240);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      part._40_8_ = part._40_8_ & 0xffffffff;
                      part.end_of_pins = (uint)lVar11;
                      lVar11 = strtol(p,&p,10);
                      iVar8 = (int)lVar11;
                      if (iVar8 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_240,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&netid);
                        std::operator+(&local_260,&local_240,":");
                        std::__cxx11::to_string((string *)&point,0x69);
                        std::operator+(&local_220,&local_260,(string *)&point);
                        std::operator+(&local_200,&local_220,": ");
                        std::operator+(&local_1e0,&local_200,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_1c0,&local_1e0,": Assertion `");
                        std::operator+(&local_198,&local_1c0,"value >= 0");
                        std::operator+(&local_168,&local_198,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&point);
                        std::__cxx11::string::~string((string *)&local_260);
                        std::__cxx11::string::~string((string *)&local_240);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      BVar9 = (BRDPartMountingSide)(iVar8 == 2);
                      if (iVar8 == 1) {
                        BVar9 = Top;
                      }
                      part.mounting_side = BVar9;
                      std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(this_01,&part);
                      std::__cxx11::string::~string((string *)&part.mfgcode);
                      goto LAB_00126e86;
                    case 4:
                      if ((ulong)local_178->num_pins <=
                          (ulong)(((long)(local_178->pins).
                                         super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                  (long)(local_178->pins).
                                        super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                                        super__Vector_impl_data._M_start) / 0x38)) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&point);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x75);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "BRD2File::BRD2File(std::vector<char> &)");
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"pins.size() < num_pins");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      part.mfgcode._M_string_length =
                           part.mfgcode._M_string_length & 0xffffffff00000000;
                      part.name = (char *)0x0;
                      part.mfgcode._M_dataplus._M_p = (pointer)0x0;
                      part.mfgcode.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_72a25;
                      part.mfgcode.field_2._8_8_ = 0x3fe0000000000000;
                      part.mounting_side = Both;
                      part.part_type = SMD;
                      part.end_of_pins = 0;
                      part.p1.x = 0;
                      lVar11 = strtol((char *)pbVar23,&p,10);
                      part.name = (char *)CONCAT44(part.name._4_4_,(int)lVar11);
                      lVar11 = strtol(p,&p,10);
                      part.name = (char *)CONCAT44((int)lVar11,part.name._0_4_);
                      lVar11 = strtol(p,&p,10);
                      puVar17 = local_170;
                      if ((int)lVar11 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_240,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,&local_269);
                        std::operator+(&local_260,&local_240,":");
                        std::__cxx11::to_string((string *)&point,0x7a);
                        std::operator+(&local_220,&local_260,(string *)&point);
                        std::operator+(&local_200,&local_220,": ");
                        std::operator+(&local_1e0,&local_200,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_1c0,&local_1e0,": Assertion `");
                        std::operator+(&local_198,&local_1c0,"value >= 0");
                        std::operator+(&local_168,&local_198,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&point);
                        std::__cxx11::string::~string((string *)&local_260);
                        std::__cxx11::string::~string((string *)&local_240);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      netid = (int)lVar11;
                      lVar11 = strtol(p,&p,10);
                      iVar8 = (int)lVar11;
                      if (iVar8 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_240,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,&local_269);
                        std::operator+(&local_260,&local_240,":");
                        std::__cxx11::to_string((string *)&point,0x7b);
                        std::operator+(&local_220,&local_260,(string *)&point);
                        std::operator+(&local_200,&local_220,": ");
                        std::operator+(&local_1e0,&local_200,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_1c0,&local_1e0,": Assertion `");
                        std::operator+(&local_198,&local_1c0,"value >= 0");
                        std::operator+(&local_168,&local_198,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&point);
                        std::__cxx11::string::~string((string *)&local_260);
                        std::__cxx11::string::~string((string *)&local_240);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      uVar20 = (uint)(iVar8 == 2);
                      if (iVar8 == 1) {
                        uVar20 = 2;
                      }
                      part.mfgcode._M_string_length =
                           CONCAT44(part.mfgcode._M_string_length._4_4_,uVar20);
                      ppcVar13 = std::__detail::
                                 _Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 ::at((_Map_base<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)&nets,&netid);
                      part.mfgcode.field_2._M_allocated_capacity = (size_type)*ppcVar13;
                      part.mfgcode._M_dataplus._M_p = (pointer)0x1;
                      std::vector<BRDPin,_std::allocator<BRDPin>_>::push_back
                                (this_00,(value_type *)&part);
                      goto LAB_0012701a;
                    case 5:
                      if ((ulong)local_178->num_nails <=
                          (ulong)(((long)(local_178->nails).
                                         super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_178->nails).
                                        super__Vector_base<BRDNail,_std::allocator<BRDNail>_>.
                                        _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&point);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x8f);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "BRD2File::BRD2File(std::vector<char> &)");
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"nails.size() < num_nails");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      point.x = 0;
                      point.y = 0;
                      lVar11 = strtol((char *)pbVar23,&p,10);
                      if ((int)lVar11 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,(allocator<char> *)&netid);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x92);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"value >= 0");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      point.x = (int)lVar11;
                      lVar11 = strtol(p,&p,10);
                      point.y = (int)lVar11;
                      strtol(p,&p,10);
                      lVar11 = strtol(p,&p,10);
                      puVar17 = local_170;
                      if ((int)lVar11 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,&local_269);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x95);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"value >= 0");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      netid = (int)lVar11;
                      iVar12 = std::
                               _Hashtable<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               ::find(&nets._M_h,&netid);
                      if (iVar12.super__Node_iterator_base<std::pair<const_int,_char_*>,_false>.
                          _M_cur == (__node_type *)0x0) {
                        poVar15 = std::operator<<((ostream *)&std::cerr,"Missing net id: ");
                        poVar15 = (ostream *)std::ostream::operator<<(poVar15,netid);
                        std::endl<char,std::char_traits<char>>(poVar15);
                      }
                      lVar11 = strtol(p,&p,10);
                      if ((int)lVar11 < 0) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_260,
                                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                                   ,&local_269);
                        std::operator+(&local_220,&local_260,":");
                        std::__cxx11::to_string(&local_240,0x9f);
                        std::operator+(&local_200,&local_220,&local_240);
                        std::operator+(&local_1e0,&local_200,": ");
                        std::operator+(&local_1c0,&local_1e0,
                                       "auto BRD2File::BRD2File(std::vector<char> &)::(anonymous class)::operator()() const"
                                      );
                        std::operator+(&local_198,&local_1c0,": Assertion `");
                        std::operator+(&local_168,&local_198,"value >= 0");
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&part,&local_168,"\' failed.");
                        psVar5 = local_268;
                        std::__cxx11::string::operator=(local_268,(string *)&part);
                        std::__cxx11::string::~string((string *)&part);
                        std::__cxx11::string::~string((string *)&local_168);
                        std::__cxx11::string::~string((string *)&local_198);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1e0);
                        std::__cxx11::string::~string((string *)&local_200);
                        std::__cxx11::string::~string((string *)&local_240);
                        std::__cxx11::string::~string((string *)&local_220);
                        std::__cxx11::string::~string((string *)&local_260);
                        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
                      }
                      std::vector<BRDNail,_std::allocator<BRDNail>_>::push_back
                                (local_a0,(value_type *)&point);
                      goto LAB_00128850;
                    }
                  }
                }
              }
            }
          }
        }
        puVar17 = puVar17 + 2;
      }
      if ((long)(local_178->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(local_178->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (ulong)local_178->num_format) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,(allocator<char> *)&point);
        std::operator+(&local_220,&local_260,":");
        std::__cxx11::to_string(&local_240,0xad);
        std::operator+(&local_200,&local_220,&local_240);
        std::operator+(&local_1e0,&local_200,": ");
        std::operator+(&local_1c0,&local_1e0,"BRD2File::BRD2File(std::vector<char> &)");
        std::operator+(&local_198,&local_1c0,": Assertion `");
        std::operator+(&local_168,&local_198,"num_format == format.size()");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                       &local_168,"\' failed.");
        psVar5 = local_268;
        std::__cxx11::string::operator=(local_268,(string *)&part);
        std::__cxx11::string::~string((string *)&part);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_260);
        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
      }
      if (nets._M_h._M_element_count != (local_b0 & 0xffffffff)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,(allocator<char> *)&point);
        std::operator+(&local_220,&local_260,":");
        std::__cxx11::to_string(&local_240,0xae);
        std::operator+(&local_200,&local_220,&local_240);
        std::operator+(&local_1e0,&local_200,": ");
        std::operator+(&local_1c0,&local_1e0,"BRD2File::BRD2File(std::vector<char> &)");
        std::operator+(&local_198,&local_1c0,": Assertion `");
        std::operator+(&local_168,&local_198,"num_nets == nets.size()");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                       &local_168,"\' failed.");
        psVar5 = local_268;
        std::__cxx11::string::operator=(local_268,(string *)&part);
        std::__cxx11::string::~string((string *)&part);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_260);
        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
      }
      if (((long)(local_178->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(local_178->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x48 != (ulong)local_178->num_parts) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,(allocator<char> *)&point);
        std::operator+(&local_220,&local_260,":");
        std::__cxx11::to_string(&local_240,0xaf);
        std::operator+(&local_200,&local_220,&local_240);
        std::operator+(&local_1e0,&local_200,": ");
        std::operator+(&local_1c0,&local_1e0,"BRD2File::BRD2File(std::vector<char> &)");
        std::operator+(&local_198,&local_1c0,": Assertion `");
        std::operator+(&local_168,&local_198,"num_parts == parts.size()");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                       &local_168,"\' failed.");
        psVar5 = local_268;
        std::__cxx11::string::operator=(local_268,(string *)&part);
        std::__cxx11::string::~string((string *)&part);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_260);
        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
      }
      if (((long)(local_178->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(local_178->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x38 != (ulong)local_178->num_pins) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,(allocator<char> *)&point);
        std::operator+(&local_220,&local_260,":");
        std::__cxx11::to_string(&local_240,0xb0);
        std::operator+(&local_200,&local_220,&local_240);
        std::operator+(&local_1e0,&local_200,": ");
        std::operator+(&local_1c0,&local_1e0,"BRD2File::BRD2File(std::vector<char> &)");
        std::operator+(&local_198,&local_1c0,": Assertion `");
        std::operator+(&local_168,&local_198,"num_pins == pins.size()");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                       &local_168,"\' failed.");
        psVar5 = local_268;
        std::__cxx11::string::operator=(local_268,(string *)&part);
        std::__cxx11::string::~string((string *)&part);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_260);
        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
      }
      if (((long)(local_178->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(local_178->nails).super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x18 != (ulong)local_178->num_nails) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BRD2File.cpp"
                   ,(allocator<char> *)&point);
        std::operator+(&local_220,&local_260,":");
        std::__cxx11::to_string(&local_240,0xb1);
        std::operator+(&local_200,&local_220,&local_240);
        std::operator+(&local_1e0,&local_200,": ");
        std::operator+(&local_1c0,&local_1e0,"BRD2File::BRD2File(std::vector<char> &)");
        std::operator+(&local_198,&local_1c0,": Assertion `");
        std::operator+(&local_168,&local_198,"num_nails == nails.size()");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&part,
                       &local_168,"\' failed.");
        psVar5 = local_268;
        std::__cxx11::string::operator=(local_268,(string *)&part);
        std::__cxx11::string::~string((string *)&part);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_260);
        SDL_LogError(1,"%s",*(undefined8 *)psVar5);
      }
      pBVar6 = local_178;
      pBVar2 = (local_178->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = ((long)(local_178->parts).super__Vector_base<BRDPart,_std::allocator<BRDPart>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x48;
      local_170 = &pBVar2[1].end_of_pins;
      pBVar3 = (local_178->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pBVar4 = (local_178->pins).super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      for (lVar18 = 0; lVar18 != lVar10; lVar18 = lVar18 + 1) {
        BVar9 = pBVar2[lVar18].mounting_side;
        if (BVar9 == Bottom) {
          pBVar2[lVar18].p1.y = iVar24 - pBVar2[lVar18].p1.y;
          pBVar2[lVar18].p2.y = iVar24 - pBVar2[lVar18].p2.y;
        }
        uVar20 = (uint)(((long)pBVar3 - (long)pBVar4) / 0x38);
        if (lVar18 != lVar10 + -1) {
          uVar20 = local_170[lVar18 * 0x12];
        }
        lVar11 = (long)(int)lVar11;
        piVar25 = &(this_00->super__Vector_base<BRDPin,_std::allocator<BRDPin>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar11].pos.y;
        bVar19 = true;
        for (; lVar11 < (int)uVar20; lVar11 = lVar11 + 1) {
          piVar25[2] = (int)lVar18 + 1;
          if (piVar25[3] == 2) {
            if (BVar9 == Top) {
LAB_00129290:
              bVar19 = false;
            }
          }
          else {
            *piVar25 = iVar24 - *piVar25;
            if ((BVar9 == Bottom) && (piVar25[3] == 1)) goto LAB_00129290;
          }
          piVar25 = piVar25 + 0xe;
        }
        if (bVar19) {
          pBVar2[lVar18].mounting_side = Both;
        }
        pBVar2[lVar18].part_type = (uint)bVar19;
      }
      iVar24 = 2;
      while (iVar24 != 0) {
        part.mfgcode._M_dataplus._M_p = (pointer)&part.mfgcode.field_2;
        part.mfgcode._M_string_length = 0;
        part.mfgcode.field_2._M_allocated_capacity =
             part.mfgcode.field_2._M_allocated_capacity & 0xffffffffffffff00;
        part.p1.y = 0;
        part.p2.x = 0;
        part.p2.y = 0;
        part.end_of_pins = 0;
        part.p1.x = 0;
        part.name = "...";
        part.part_type = SMD;
        part.mounting_side = (iVar24 != 2) + 1;
        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back(this_01,&part);
        std::__cxx11::string::~string((string *)&part.mfgcode);
        iVar24 = iVar24 + -1;
      }
      BRDFileBase::AddNailsAsPins(pBVar6);
      local_178->valid = iVar8 != 0;
      std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
                (&lines.super__Vector_base<char_*,_std::allocator<char_*>_>);
    }
  }
  std::
  _Hashtable<int,_std::pair<const_int,_char_*>,_std::allocator<std::pair<const_int,_char_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&nets._M_h);
  return;
}

Assistant:

BRD2File::BRD2File(std::vector<char> &buf) {
	auto buffer_size = buf.size();
	std::unordered_map<int, char *> nets; // Map between net id and net name
	unsigned int num_nets = 0;
	BRDPoint max{0, 0}; // Top-right board boundary

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	int current_block = 0;

	std::vector<char *>  lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (strstr(line, "BRDOUT:") == line) {
			current_block = 1;
			p += 7; // Skip "BRDOUT:"
			num_format = READ_UINT();
			max.x      = READ_INT();
			max.y      = READ_INT();
			continue;
		}
		if (strstr(line, "NETS:") == line) {
			current_block = 2;
			p += 5; // Skip "NETS:"
			num_nets = READ_UINT();
			continue;
		}
		if (strstr(line, "PARTS:") == line) {
			current_block = 3;
			p += 6; // Skip "PARTS:"
			num_parts = READ_UINT();
			continue;
		}
		if (strstr(line, "PINS:") == line) {
			current_block = 4;
			p += 5; // Skip "PINS:"
			num_pins = READ_UINT();
			continue;
		}
		if (strstr(line, "NAILS:") == line) {
			current_block = 5;
			p += 6; // Skip "NAILS:"
			num_nails = READ_UINT();
			continue;
		}

		switch (current_block) {
			case 1: { // Format
				ENSURE(format.size() < num_format, error_msg);
				BRDPoint point;
				point.x = READ_INT();
				point.y = READ_INT();
				ENSURE(point.x <= max.x, error_msg);
				ENSURE(point.y <= max.y, error_msg);
				format.push_back(point);
			} break;

			case 2: { // Nets
				ENSURE(nets.size() < num_nets, error_msg);
				int id   = READ_UINT();
				nets[id] = READ_STR();
			} break;

			case 3: { // PARTS
				ENSURE(parts.size() < num_parts, error_msg);
				BRDPart part;

				part.name        = READ_STR();
				part.p1.x        = READ_INT();
				part.p1.y        = READ_INT();
				part.p2.x        = READ_INT();
				part.p2.y        = READ_INT();
				part.end_of_pins = READ_UINT(); // Warning: not end but beginning in this format
				part.part_type   = BRDPartType::SMD;
				int side         = READ_UINT();
				if (side == 1)
					part.mounting_side = BRDPartMountingSide::Top; // SMD part on top
				else if (side == 2)
					part.mounting_side = BRDPartMountingSide::Bottom; // SMD part on bottom
				else //0
					part.mounting_side = BRDPartMountingSide::Both;

				parts.push_back(part);
			} break;

			case 4: { // PINS
				ENSURE(pins.size() < num_pins, error_msg);
				BRDPin pin;

				pin.pos.x = READ_INT();
				pin.pos.y = READ_INT();
				int netid = READ_UINT();
				unsigned int side  = READ_UINT();
				if (side == 1)
					pin.side = BRDPinSide::Top;
				else if (side == 2)
					pin.side = BRDPinSide::Bottom;
				else //0
					pin.side = BRDPinSide::Both;

				try {
					pin.net = nets.at(netid);
				} catch (const std::out_of_range &e) {
					pin.net = "";
				}

				pin.probe = 1;
				pin.part  = 0;
				pins.push_back(pin);
			} break;

			case 5: { // NAILS
				ENSURE(nails.size() < num_nails, error_msg);
				BRDNail nail;

				nail.probe = READ_UINT();
				nail.pos.x = READ_INT();
				nail.pos.y = READ_INT();
				int netid  = READ_UINT();

				auto inet = nets.find(netid);
				if (inet != nets.end())
					nail.net = inet->second;
				else {
					nail.net = "UNCONNECTED";
					std::cerr << "Missing net id: " << netid << std::endl;
				}

				bool nail_is_top = READ_UINT() == 1;
				if (nail_is_top) {
					nail.side = BRDPartMountingSide::Top;
				} else {
					nail.side = BRDPartMountingSide::Bottom;
					nail.pos.y = max.y - nail.pos.y;
				}
				nails.push_back(nail);

			} break;
			default: continue;
		}
	}

	ENSURE(num_format == format.size(), error_msg);
	ENSURE(num_nets == nets.size(), error_msg);
	ENSURE(num_parts == parts.size(), error_msg);
	ENSURE(num_pins == pins.size(), error_msg);
	ENSURE(num_nails == nails.size(), error_msg);

	/*
	 * Postprocess the data.  Specifically we need to allocate
	 * pins to parts.  So with this it's easiest to just iterate
	 * through the parts and pick up the pins required
	 */
	{
		int pei;     // pin end index (part[i+1].pin# -1
		int cpi = 0; // current pin index
		for (decltype(parts)::size_type i = 0; i < parts.size(); i++) {
			bool isDIP = true;

			if (parts[i].mounting_side == BRDPartMountingSide::Bottom) { // Part on bottom
				parts[i].p1.y = max.y - parts[i].p1.y;
				parts[i].p2.y = max.y - parts[i].p2.y;
			}

			if (i == parts.size() - 1) {
				pei = pins.size();
			} else {
				pei = parts[i + 1].end_of_pins; // Again, not end of pins but beginning
			}

			while (cpi < pei) {
				pins[cpi].part                           = i + 1;
				if (pins[cpi].side != BRDPinSide::Top) pins[cpi].pos.y = max.y - pins[cpi].pos.y;
				if ((pins[cpi].side == BRDPinSide::Top && parts[i].mounting_side == BRDPartMountingSide::Top) ||
				    (pins[cpi].side == BRDPinSide::Bottom && parts[i].mounting_side == BRDPartMountingSide::Bottom)) {
					// Pins on the same side as the part
					isDIP = false;
				}
				cpi++;
			}

			if (isDIP) {
				// All pins are through hole so part is DIP
				parts[i].part_type     = BRDPartType::ThroughHole;
				parts[i].mounting_side = BRDPartMountingSide::Both;
			} else {
				parts[i].part_type = BRDPartType::SMD;
			}
		}
	}

	for (auto i = 1; i <= 2; i++) { // Add dummy parts for probe points on both sides
		BRDPart part;
		part.name = "...";
		part.mounting_side =
		    (i == 1 ? BRDPartMountingSide::Bottom : BRDPartMountingSide::Top); // First part is bottom, last is top.
		part.end_of_pins = 0;                                                  // Unused
		parts.push_back(part);
	}

	AddNailsAsPins();

	valid = current_block != 0;
}